

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O2

void mcsFile::WriteSectorHeader(ofstream *file,uint num)

{
  ostream *poVar1;
  
  *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x18) =
       *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::operator<<(file,0x30);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) | 0x4000;
  poVar1 = std::operator<<((ostream *)file,":");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::operator<<(poVar1,"02000004");
  *(undefined8 *)(file + *(long *)(*(long *)file + -0x18) + 0x10) = 4;
  std::ostream::operator<<(file,(ushort)num);
  *(undefined8 *)(file + *(long *)(*(long *)file + -0x18) + 0x10) = 2;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)file);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void mcsFile::WriteSectorHeader(std::ofstream &file, unsigned int num)
{
    file << std::hex << std::setfill('0') << std::uppercase;
    file << ":" << std::hex << "02000004";
    unsigned long csum_computed = 0x02 + 0x04;
    file << std::setw(4) << static_cast<unsigned short>(num);
    csum_computed += num&0x000000ff;
    csum_computed += (num&0x0000ff00)>>8;
    csum_computed = (~csum_computed+1)&0x000000ff;
    file << std::setw(2) << csum_computed << std::endl;
}